

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_extract.cpp
# Opt level: O2

ScalarFunctionSet * duckdb::StructExtractFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  ScalarFunctionSet *in_RDI;
  allocator local_281;
  string local_280;
  ScalarFunction local_260;
  ScalarFunction local_138;
  
  ::std::__cxx11::string::string((string *)&local_280,"struct_extract",&local_281);
  ScalarFunctionSet::ScalarFunctionSet(in_RDI,&local_280);
  ::std::__cxx11::string::~string((string *)&local_280);
  GetKeyExtractFunction();
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_138);
  ScalarFunction::~ScalarFunction(&local_138);
  GetIndexExtractFunction();
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_260);
  ScalarFunction::~ScalarFunction(&local_260);
  return in_RDI;
}

Assistant:

ScalarFunctionSet StructExtractFun::GetFunctions() {
	// the arguments and return types are actually set in the binder function
	ScalarFunctionSet struct_extract_set("struct_extract");
	struct_extract_set.AddFunction(GetKeyExtractFunction());
	struct_extract_set.AddFunction(GetIndexExtractFunction());
	return struct_extract_set;
}